

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O1

exr_result_t
internal_exr_add_part(_internal_exr_context *f,_internal_exr_part **outpart,int *new_index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  exr_result_t eVar4;
  _internal_exr_part *__s;
  _internal_exr_part **pp_Var5;
  long lVar6;
  
  iVar2 = f->num_parts;
  if (new_index != (int *)0x0) {
    *new_index = iVar2;
  }
  lVar1 = (long)iVar2 + 1;
  if (iVar2 != 0) {
    __s = (_internal_exr_part *)(*f->alloc_fn)(0x108);
    if (__s != (_internal_exr_part *)0x0) {
      pp_Var5 = (_internal_exr_part **)(*f->alloc_fn)(lVar1 * 8);
      if (pp_Var5 != (_internal_exr_part **)0x0) {
        memset(__s,0,0x108);
        goto LAB_00115284;
      }
      (*f->free_fn)(__s);
    }
    eVar4 = (*f->standard_error)(f,1);
    return eVar4;
  }
  __s = &f->first_part;
  pp_Var5 = &f->init_part;
  f->init_part = __s;
LAB_00115284:
  __s->storage_mode = EXR_STORAGE_LAST_TYPE;
  (__s->data_window).max.field_0 = (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0xffffffffffffffff;
  (__s->display_window).max.field_0 =
       (anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0)0xffffffffffffffff;
  __s->chunk_count = -1;
  __s->zip_compression_level = f->default_zip_level;
  __s->dwa_compression_level = f->default_dwa_quality;
  if (0 < iVar2) {
    iVar3 = f->num_parts;
    if (0 < (long)iVar3) {
      lVar6 = 0;
      do {
        pp_Var5[lVar6] = f->parts[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar3 != lVar6);
    }
    pp_Var5[iVar2] = __s;
  }
  if (1 < f->num_parts) {
    (*f->free_fn)(f->parts);
  }
  f->parts = pp_Var5;
  f->num_parts = (int)lVar1;
  if (outpart != (_internal_exr_part **)0x0) {
    *outpart = __s;
  }
  return 0;
}

Assistant:

exr_result_t
internal_exr_add_part (
    struct _internal_exr_context* f,
    struct _internal_exr_part**   outpart,
    int*                          new_index)
{
    int                         ncount = f->num_parts + 1;
    struct _internal_exr_part*  part;
    struct _internal_exr_part** nptrs = NULL;

    if (new_index) *new_index = f->num_parts;

    if (ncount == 1)
    {
        /* no need to zilch, the parent struct will have already been zero'ed */
        part         = &(f->first_part);
        f->init_part = part;
        nptrs        = &(f->init_part);
    }
    else
    {
        part = (struct _internal_exr_part*) f->alloc_fn (sizeof (struct _internal_exr_part));
        if (!part) return f->standard_error (f, EXR_ERR_OUT_OF_MEMORY);

        nptrs = (struct _internal_exr_part**)
            f->alloc_fn (sizeof (struct _internal_exr_part*) * (size_t) ncount);
        if (!nptrs)
        {
            f->free_fn (part);
            return f->standard_error (f, EXR_ERR_OUT_OF_MEMORY);
        }
        memset(part, 0, sizeof(struct _internal_exr_part));
    }

    /* assign appropriately invalid values */
    part->storage_mode         = EXR_STORAGE_LAST_TYPE;
    part->data_window.max.x    = -1;
    part->data_window.max.y    = -1;
    part->display_window.max.x = -1;
    part->display_window.max.y = -1;
    part->chunk_count          = -1;

    part->zip_compression_level = f->default_zip_level;
    part->dwa_compression_level = f->default_dwa_quality;

    /* put it into the part table */
    if (ncount > 1)
    {
        for (int p = 0; p < f->num_parts; ++p)
        {
            nptrs[p] = f->parts[p];
        }
        nptrs[ncount - 1] = part;
    }

    if (f->num_parts > 1) { f->free_fn (f->parts); }
    f->parts     = nptrs;
    f->num_parts = ncount;
    if (outpart) *outpart = part;

    return EXR_ERR_SUCCESS;
}